

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O3

bool __thiscall rtb::Concurrency::Queue<int>::someoneSlowerThanMe(Queue<int> *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  key_type local_30;
  
  p_Var6 = (this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    while ((_Rb_tree_header *)p_Var3 != p_Var1) {
      p_Var5 = p_Var3;
      if (*(int *)&p_Var3[1]._M_parent <= *(int *)&p_Var6[1]._M_parent) {
        p_Var5 = p_Var6;
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      p_Var6 = p_Var5;
    }
  }
  iVar2 = *(int *)&p_Var6[1]._M_parent;
  local_30._M_thread = pthread_self();
  pmVar4 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&this->subscribersMissingRead_,&local_30);
  return *pmVar4 < iVar2;
}

Assistant:

bool Queue<T>::someoneSlowerThanMe() {
        int maxNoMsgToRead =
            std::max_element(subscribersMissingRead_.begin(), subscribersMissingRead_.end(), pred)
                ->second;

        if (maxNoMsgToRead > subscribersMissingRead_[std::this_thread::get_id()]) return true;

        return false;
    }